

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcTwoDirectionRepeatFactor::IfcTwoDirectionRepeatFactor
          (IfcTwoDirectionRepeatFactor *this)

{
  IfcTwoDirectionRepeatFactor *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x50,"IfcTwoDirectionRepeatFactor");
  IfcOneDirectionRepeatFactor::IfcOneDirectionRepeatFactor
            (&this->super_IfcOneDirectionRepeatFactor,&PTR_construction_vtable_24__01008548);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTwoDirectionRepeatFactor,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTwoDirectionRepeatFactor,_1UL> *)
             &(this->super_IfcOneDirectionRepeatFactor).field_0x38,
             &PTR_construction_vtable_24__010085c0);
  (this->super_IfcOneDirectionRepeatFactor).super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x1008490;
  *(undefined8 *)&this->field_0x50 = 0x1008530;
  *(undefined8 *)
   &(this->super_IfcOneDirectionRepeatFactor).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x10084b8;
  *(undefined8 *)
   &(this->super_IfcOneDirectionRepeatFactor).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x10084e0;
  *(undefined8 *)&(this->super_IfcOneDirectionRepeatFactor).field_0x38 = 0x1008508;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcVector>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcVector> *)
             &(this->super_IfcOneDirectionRepeatFactor).field_0x48,(LazyObject *)0x0);
  return;
}

Assistant:

IfcTwoDirectionRepeatFactor() : Object("IfcTwoDirectionRepeatFactor") {}